

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5PorterCb(void *pCtx,int tflags,char *pToken,int nToken,int iStart,int iEnd)

{
  int *piVar1;
  short *psVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar10;
  byte *pbVar11;
  byte bVar12;
  ulong uVar13;
  char *zStem;
  int nBuf;
  uint uVar14;
  byte bVar15;
  undefined4 in_register_00000034;
  undefined8 uVar16;
  undefined4 in_register_00000084;
  uint uVar17;
  uint uVar18;
  
  uVar7 = CONCAT44(in_register_00000084,iStart);
  uVar13 = CONCAT44(in_register_00000034,tflags);
  if (nToken - 0x41U < 0xffffffc2) {
    uVar16 = *pCtx;
    UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
    uVar10 = (ulong)(uint)nToken;
    zStem = pToken;
    goto LAB_001f3cef;
  }
  zStem = *(char **)((long)pCtx + 0x10);
  uVar13 = (ulong)(uint)nToken;
  memcpy(zStem,pToken,uVar13);
  uVar18 = nToken;
  if (zStem[nToken - 1U] == 's') {
    uVar14 = nToken - 2;
    if (zStem[uVar14] != 's') {
      if (zStem[uVar14] == 'e') {
        uVar18 = uVar14;
        if ((uint)nToken < 5) {
          if (nToken != 4) goto LAB_001f303b;
        }
        else if ((zStem[uVar13 - 4] == 's') && (zStem[uVar13 - 3] == 's')) goto LAB_001f303d;
        if (zStem[uVar13 - 3] == 'i') goto LAB_001f303d;
      }
LAB_001f303b:
      uVar18 = nToken - 1U;
    }
  }
LAB_001f303d:
  uVar14 = uVar18 - 2;
  uVar13 = (ulong)uVar14;
  if (zStem[uVar13] == 'e') {
    if (uVar18 < 4) {
      uVar7 = 2;
      if (uVar18 == 3) goto LAB_001f310c;
      goto LAB_001f311c;
    }
    uVar17 = uVar18 - 3;
    if (zStem[(ulong)uVar17 + 2] == 'd' && *(short *)(zStem + uVar17) == 0x6565) {
      iVar6 = fts5PorterGobbleVC(zStem,uVar17,0);
      if (iVar6 != 0) {
        (zStem + uVar17)[0] = 'e';
        (zStem + uVar17)[1] = 'e';
        uVar18 = uVar18 - 1;
      }
    }
    else {
LAB_001f310c:
      if (*(short *)(zStem + uVar13) == 0x6465) {
        uVar7 = 0;
        do {
          bVar15 = zStem[uVar7] + 0x9f;
          bVar15 = bVar15 >> 1 | bVar15 * -0x80;
          if (((bVar15 < 0xb) && ((0x495U >> (bVar15 & 0x1f) & 1) != 0)) ||
             (zStem[uVar7] == 'y' && uVar7 != 0)) goto LAB_001f3557;
          uVar7 = uVar7 + 1;
        } while (uVar13 != uVar7);
      }
    }
  }
  else if ((zStem[uVar13] == 'n') && (3 < uVar18)) {
    uVar14 = uVar18 - 3;
    uVar13 = (ulong)uVar14;
    if (zStem[uVar13 + 2] == 'g' && *(short *)(zStem + uVar13) == 0x6e69) {
      uVar7 = 0;
      do {
        bVar15 = zStem[uVar7] + 0x9f;
        bVar15 = bVar15 >> 1 | bVar15 * -0x80;
        if (((bVar15 < 0xb) && ((0x495U >> (bVar15 & 0x1f) & 1) != 0)) ||
           (zStem[uVar7] == 'y' && uVar7 != 0)) goto LAB_001f3557;
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
  }
  uVar7 = (ulong)uVar18;
  goto LAB_001f311c;
LAB_001f3557:
  pbVar11 = (byte *)(zStem + (int)uVar14 + -2);
  bVar15 = *pbVar11;
  if (bVar15 == 0x69) {
    if (((int)uVar14 < 3) || (*(short *)pbVar11 != 0x7a69)) goto LAB_001f3662;
    pcVar9 = "ize";
LAB_001f3833:
    zStem[(int)uVar14] = pcVar9[2];
    *(undefined2 *)pbVar11 = *(undefined2 *)pcVar9;
    uVar14 = uVar14 + 1;
  }
  else {
    if (bVar15 == 0x62) {
      if (((int)uVar14 < 3) || (*(short *)pbVar11 != 0x6c62)) goto LAB_001f3662;
      pcVar9 = "ble";
      goto LAB_001f3833;
    }
    if (((bVar15 == 0x61) && (2 < (int)uVar14)) && (*(short *)pbVar11 == 0x7461)) {
      pcVar9 = "ate";
      goto LAB_001f3833;
    }
LAB_001f3662:
    lVar8 = (long)(int)uVar14;
    bVar3 = (zStem + lVar8)[-1];
    bVar12 = (byte)(bVar3 + 0x9f) >> 1 | (bVar3 + 0x9f) * -0x80;
    if ((((bVar12 < 0xb) && ((0x495U >> (bVar12 & 0x1f) & 1) != 0)) ||
        ((bVar3 - 0x6c < 0xf && ((0x4081U >> (bVar3 - 0x6c & 0x1f) & 1) != 0)))) ||
       (bVar3 != bVar15)) {
      iVar6 = fts5Porter_MEq1(zStem,uVar14);
      if ((iVar6 != 0) && (iVar6 = fts5Porter_Ostar(zStem,uVar14), iVar6 != 0)) {
        uVar14 = uVar14 + 1;
        zStem[lVar8] = 'e';
      }
    }
    else {
      uVar14 = uVar14 - 1;
    }
  }
  uVar7 = (ulong)uVar14;
LAB_001f311c:
  uVar18 = (uint)uVar7;
  lVar8 = (long)(int)uVar18;
  if ((1 < (int)uVar18) && (zStem[lVar8 + -1] == 'y')) {
    uVar13 = 0;
    do {
      bVar15 = zStem[uVar13] + 0x9f;
      bVar15 = bVar15 >> 1 | bVar15 * -0x80;
      if (((bVar15 < 0xb) && ((0x495U >> (bVar15 & 0x1f) & 1) != 0)) ||
         (zStem[uVar13] == 'y' && uVar13 != 0)) {
        zStem[uVar7 - 1] = 'i';
        break;
      }
      uVar13 = uVar13 + 1;
    } while ((lVar8 - 1U & 0xffffffff) != uVar13);
  }
  uVar10 = uVar7;
  switch(zStem[lVar8 + -2]) {
  case 'a':
    if ((int)uVar18 < 8) {
      if (uVar18 == 7) goto LAB_001f35f8;
    }
    else {
      uVar14 = uVar18 - 7;
      if (*(int *)(zStem + (ulong)uVar14 + 3) == 0x6c616e6f &&
          *(int *)(zStem + uVar14) == 0x6f697461) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar6 != 0) {
          pcVar9 = zStem + uVar14;
          pcVar9[2] = 'e';
          pcVar9[0] = 'a';
          pcVar9[1] = 't';
          goto LAB_001f3860;
        }
      }
      else {
LAB_001f35f8:
        uVar14 = uVar18 - 6;
        if ((*(short *)(zStem + (ulong)uVar14 + 4) == 0x6c61 &&
             *(int *)(zStem + uVar14) == 0x6e6f6974) &&
           (iVar6 = fts5PorterGobbleVC(zStem,uVar14,0), iVar6 != 0)) {
          builtin_strncpy(zStem + uVar14,"tion",4);
LAB_001f387f:
          uVar10 = (ulong)(uVar18 - 2);
        }
      }
    }
    break;
  case 'c':
    if (4 < (int)uVar18) {
      uVar18 = uVar18 - 4;
      if (*(int *)(zStem + uVar18) == 0x69636e65) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar18,0);
        if (iVar6 != 0) {
          builtin_strncpy(zStem + uVar18,"ence",4);
        }
      }
      else if ((*(int *)(zStem + uVar18) == 0x69636e61) &&
              (iVar6 = fts5PorterGobbleVC(zStem,uVar18,0), iVar6 != 0)) {
        builtin_strncpy(zStem + uVar18,"ance",4);
      }
    }
    break;
  case 'e':
    if (4 < (int)uVar18) {
      uVar18 = uVar18 - 4;
      if ((*(int *)(zStem + uVar18) == 0x72657a69) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar18,0), iVar6 != 0)) {
        pcVar9 = zStem + uVar18;
        pcVar9[2] = 'e';
        pcVar9[0] = 'i';
        pcVar9[1] = 'z';
LAB_001f36f9:
        uVar10 = lVar8 - 1U & 0xffffffff;
      }
    }
    break;
  case 'g':
    if (4 < (int)uVar18) {
      uVar18 = uVar18 - 4;
      if ((*(int *)(zStem + uVar18) == 0x69676f6c) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar18,0), iVar6 != 0)) {
        pcVar9 = zStem + uVar18;
        pcVar9[2] = 'g';
        pcVar9[0] = 'l';
        pcVar9[1] = 'o';
        goto LAB_001f36f9;
      }
    }
    break;
  case 'l':
    if (3 < (int)uVar18) {
      uVar14 = uVar18 - 3;
      psVar2 = (short *)(zStem + uVar14);
      if (zStem[(ulong)uVar14 + 2] == 'i' && *(short *)(zStem + uVar14) == 0x6c62) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar6 != 0) {
          *(undefined1 *)(psVar2 + 1) = 0x65;
          *psVar2 = 0x6c62;
        }
      }
      else if (uVar18 == 4) {
LAB_001f3700:
        if ((char)psVar2[1] == 'i' && *psVar2 == 0x6c65) {
LAB_001f371b:
          iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
          if (iVar6 != 0) {
            *(undefined1 *)psVar2 = 0x65;
            goto LAB_001f387f;
          }
        }
      }
      else {
        uVar17 = uVar18 - 4;
        if (*(int *)(zStem + uVar17) != 0x696c6c61) {
          if (uVar18 < 6) goto LAB_001f3700;
          uVar17 = uVar18 - 5;
          piVar1 = (int *)(zStem + uVar17);
          if (zStem[(ulong)uVar17 + 4] != 'i' || *(int *)(zStem + uVar17) != 0x6c746e65) {
            if ((char)psVar2[1] != 'i' || *psVar2 != 0x6c65) {
              if (((char)piVar1[1] == 'i' && *piVar1 == 0x6c73756f) &&
                 (iVar6 = fts5PorterGobbleVC(zStem,uVar17,0), iVar6 != 0)) {
                *(undefined1 *)((long)piVar1 + 2) = 0x73;
                *(undefined2 *)piVar1 = 0x756f;
                goto LAB_001f387f;
              }
              break;
            }
            goto LAB_001f371b;
          }
          iVar6 = fts5PorterGobbleVC(zStem,uVar17,0);
          if (iVar6 == 0) break;
          *(undefined1 *)((long)piVar1 + 2) = 0x74;
          *(undefined2 *)piVar1 = 0x6e65;
          goto LAB_001f387f;
        }
        iVar6 = fts5PorterGobbleVC(zStem,uVar17,0);
        if (iVar6 != 0) {
          (zStem + uVar17)[0] = 'a';
          (zStem + uVar17)[1] = 'l';
          goto LAB_001f387f;
        }
      }
    }
    break;
  case 'o':
    if ((int)uVar18 < 8) {
      if (5 < (int)uVar18) goto LAB_001f35aa;
      if (uVar18 != 5) break;
LAB_001f36c2:
      uVar18 = uVar18 - 4;
      if ((*(int *)(zStem + uVar18) == 0x726f7461) &&
         (iVar6 = fts5PorterGobbleVC(zStem,uVar18,0), iVar6 != 0)) {
        pcVar9 = zStem + uVar18;
        pcVar9[2] = 'e';
        pcVar9[0] = 'a';
        pcVar9[1] = 't';
        goto LAB_001f36f9;
      }
    }
    else {
      uVar14 = uVar18 - 7;
      if (*(int *)(zStem + (ulong)uVar14 + 3) == 0x6e6f6974 &&
          *(int *)(zStem + uVar14) == 0x74617a69) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar6 != 0) {
          pcVar9 = zStem + uVar14;
          pcVar9[2] = 'e';
          pcVar9[0] = 'i';
          pcVar9[1] = 'z';
          goto LAB_001f3860;
        }
      }
      else {
LAB_001f35aa:
        uVar14 = uVar18 - 5;
        if (zStem[(ulong)uVar14 + 4] != 'n' || *(int *)(zStem + uVar14) != 0x6f697461)
        goto LAB_001f36c2;
        iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar6 != 0) {
          pcVar9 = zStem + uVar14;
          pcVar9[2] = 'e';
          pcVar9[0] = 'a';
          pcVar9[1] = 't';
          goto LAB_001f387f;
        }
      }
    }
    break;
  case 's':
    if (5 < (int)uVar18) {
      uVar14 = uVar18 - 5;
      if (zStem[(ulong)uVar14 + 4] == 'm' && *(int *)(zStem + uVar14) == 0x73696c61) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar6 != 0) {
          (zStem + uVar14)[0] = 'a';
          (zStem + uVar14)[1] = 'l';
          goto LAB_001f378c;
        }
      }
      else if (7 < uVar18) {
        uVar14 = uVar18 - 7;
        piVar1 = (int *)(zStem + uVar14);
        if (*(int *)(zStem + (ulong)uVar14 + 3) == 0x7373656e &&
            *(int *)(zStem + uVar14) == 0x6e657669) {
          iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
          if (iVar6 != 0) {
            *(undefined1 *)((long)piVar1 + 2) = 0x65;
            *(undefined2 *)piVar1 = 0x7669;
            goto LAB_001f3860;
          }
        }
        else if (*(int *)((long)piVar1 + 3) == 0x7373656e && *piVar1 == 0x6e6c7566) {
          iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
          if (iVar6 != 0) {
            *(undefined1 *)((long)piVar1 + 2) = 0x6c;
            *(undefined2 *)piVar1 = 0x7566;
            goto LAB_001f3860;
          }
        }
        else if ((*(int *)((long)piVar1 + 3) == 0x7373656e && *piVar1 == 0x6e73756f) &&
                (iVar6 = fts5PorterGobbleVC(zStem,uVar14,0), iVar6 != 0)) {
          *(undefined1 *)((long)piVar1 + 2) = 0x73;
          *(undefined2 *)piVar1 = 0x756f;
LAB_001f3860:
          uVar10 = (ulong)(uVar18 - 4);
        }
      }
    }
    break;
  case 't':
    if (5 < (int)uVar18) {
      uVar14 = uVar18 - 5;
      piVar1 = (int *)(zStem + uVar14);
      if (zStem[(ulong)uVar14 + 4] == 'i' && *(int *)(zStem + uVar14) == 0x74696c61) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar6 != 0) {
          *(undefined2 *)piVar1 = 0x6c61;
LAB_001f378c:
          uVar10 = (ulong)(uVar18 - 3);
        }
      }
      else if ((char)piVar1[1] == 'i' && *piVar1 == 0x74697669) {
        iVar6 = fts5PorterGobbleVC(zStem,uVar14,0);
        if (iVar6 != 0) {
          *(undefined1 *)((long)piVar1 + 2) = 0x65;
          *(undefined2 *)piVar1 = 0x7669;
          goto LAB_001f387f;
        }
      }
      else {
        uVar10 = 6;
        if (uVar18 != 6) {
          uVar14 = uVar18 - 6;
          uVar10 = uVar7;
          if ((*(short *)(zStem + (ulong)uVar14 + 4) == 0x6974 &&
               *(int *)(zStem + uVar14) == 0x696c6962) &&
             (iVar6 = fts5PorterGobbleVC(zStem,uVar14,0), iVar6 != 0)) {
            pcVar9 = zStem + uVar14;
            pcVar9[2] = 'e';
            pcVar9[0] = 'b';
            pcVar9[1] = 'l';
            goto LAB_001f378c;
          }
        }
      }
    }
  }
  iVar6 = (int)uVar10;
  switch(zStem[(long)iVar6 + -2]) {
  case 's':
    if ((4 < iVar6) && (uVar13 = (ulong)(iVar6 - 4), *(int *)(zStem + uVar13) == 0x7373656e)) {
LAB_001f3a02:
      iVar6 = fts5PorterGobbleVC(zStem,(int)uVar13,0);
      if (iVar6 != 0) {
LAB_001f3a13:
        uVar10 = uVar13;
      }
    }
    break;
  case 't':
    if (5 < iVar6) {
      uVar18 = iVar6 - 5;
      if (((zStem[(ulong)uVar18 + 4] == 'e' && *(int *)(zStem + uVar18) == 0x74616369) ||
          (zStem[(ulong)uVar18 + 4] == 'i' && *(int *)(zStem + uVar18) == 0x74696369)) &&
         (iVar5 = fts5PorterGobbleVC(zStem,uVar18,0), iVar5 != 0)) {
        (zStem + uVar18)[0] = 'i';
        (zStem + uVar18)[1] = 'c';
LAB_001f39db:
        uVar18 = iVar6 - 3;
LAB_001f39de:
        uVar13 = (ulong)uVar18;
        goto LAB_001f3a13;
      }
    }
    break;
  case 'u':
    if ((3 < iVar6) &&
       (uVar13 = (ulong)(iVar6 - 3),
       zStem[uVar13 + 2] == 'l' && *(short *)(zStem + uVar13) == 0x7566)) goto LAB_001f3a02;
    break;
  case 'v':
    if ((5 < iVar6) &&
       (uVar13 = (ulong)(iVar6 - 5),
       zStem[uVar13 + 4] == 'e' && *(int *)(zStem + uVar13) == 0x76697461)) goto LAB_001f3a02;
    break;
  case 'w':
  case 'x':
  case 'y':
    break;
  case 'z':
    if (5 < iVar6) {
      uVar18 = iVar6 - 5;
      if ((zStem[(ulong)uVar18 + 4] == 'e' && *(int *)(zStem + uVar18) == 0x7a696c61) &&
         (iVar5 = fts5PorterGobbleVC(zStem,uVar18,0), iVar5 != 0)) {
        (zStem + uVar18)[0] = 'a';
        (zStem + uVar18)[1] = 'l';
        goto LAB_001f39db;
      }
    }
    break;
  default:
    if ((zStem[(long)iVar6 + -2] == 'a') && (4 < iVar6)) {
      uVar18 = iVar6 - 4;
      if ((*(int *)(zStem + uVar18) == 0x6c616369) &&
         (iVar5 = fts5PorterGobbleVC(zStem,uVar18,0), iVar5 != 0)) {
        (zStem + uVar18)[0] = 'i';
        (zStem + uVar18)[1] = 'c';
        uVar18 = iVar6 - 2;
        goto LAB_001f39de;
      }
    }
  }
  uVar18 = (uint)uVar10;
  if ((byte)zStem[(long)(int)uVar18 + -2] - 0x61 < 0x1a) {
    uVar13 = (long)(int)uVar18 - 2;
    switch((uint)(byte)zStem[(long)(int)uVar18 + -2]) {
    case 0x61:
      if ((2 < (int)uVar18) && (*(short *)(zStem + uVar13) == 0x6c61)) {
LAB_001f3c7d:
        iVar6 = fts5Porter_MGt1(zStem,(int)uVar13);
        uVar7 = uVar13;
LAB_001f3c88:
        if (iVar6 != 0) {
          uVar10 = uVar7 & 0xffffffff;
        }
      }
      break;
    case 99:
      if ((4 < (int)uVar18) &&
         ((uVar13 = (ulong)(uVar18 - 4), *(int *)(zStem + uVar13) == 0x65636e61 ||
          (*(int *)(zStem + uVar13) == 0x65636e65)))) goto LAB_001f3c7d;
      break;
    case 0x65:
      if ((2 < (int)uVar18) && (*(short *)(zStem + uVar13) == 0x7265)) goto LAB_001f3c7d;
      break;
    case 0x69:
      if ((2 < (int)uVar18) && (*(short *)(zStem + uVar13) == 0x6369)) goto LAB_001f3c7d;
      break;
    case 0x6c:
      if ((4 < (int)uVar18) &&
         ((uVar13 = (ulong)(uVar18 - 4), *(int *)(zStem + uVar13) == 0x656c6261 ||
          (*(int *)(zStem + uVar13) == 0x656c6269)))) goto LAB_001f3c7d;
      break;
    case 0x6e:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        if (zStem[uVar13 + 2] == 't' && *(short *)(zStem + uVar13) == 0x6e61) goto LAB_001f3c7d;
        if (uVar18 < 6) {
          if (uVar18 != 4) goto LAB_001f3c54;
        }
        else {
          uVar7 = (ulong)(uVar18 - 5);
          if (zStem[uVar7 + 4] == 't' && *(int *)(zStem + uVar7) == 0x6e656d65) goto LAB_001f3d22;
LAB_001f3c54:
          uVar7 = (ulong)(uVar18 - 4);
          if (*(int *)(zStem + uVar7) == 0x746e656d) goto LAB_001f3d22;
        }
        uVar4 = *(ushort *)(zStem + uVar13) ^ 0x6e65;
        bVar15 = zStem[uVar13 + 2] ^ 0x74;
LAB_001f3c78:
        if (bVar15 == 0 && uVar4 == 0) goto LAB_001f3c7d;
      }
      break;
    case 0x6f:
      if ((int)uVar18 < 4) {
        if (uVar18 == 3) goto LAB_001f3c44;
      }
      else {
        uVar7 = (ulong)(uVar18 - 3);
        if (zStem[uVar7 + 2] == 'n' && *(short *)(zStem + uVar7) == 0x6f69) {
          if (1 < (byte)(zStem[uVar7 - 1] + 0x8dU)) break;
LAB_001f3d22:
          iVar6 = fts5Porter_MGt1(zStem,(int)uVar7);
          goto LAB_001f3c88;
        }
LAB_001f3c44:
        if (*(short *)(zStem + uVar13) == 0x756f) goto LAB_001f3c7d;
      }
      break;
    case 0x73:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        uVar4 = *(ushort *)(zStem + uVar13) ^ 0x7369;
        bVar15 = zStem[uVar13 + 2] ^ 0x6d;
        goto LAB_001f3c78;
      }
      break;
    case 0x74:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        if (zStem[uVar13 + 2] != 'e' || *(short *)(zStem + uVar13) != 0x7461) {
          uVar4 = *(ushort *)(zStem + uVar13) ^ 0x7469;
          bVar15 = zStem[uVar13 + 2] ^ 0x69;
          goto LAB_001f3c78;
        }
        goto LAB_001f3c7d;
      }
      break;
    case 0x75:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        uVar4 = *(ushort *)(zStem + uVar13) ^ 0x756f;
        bVar15 = zStem[uVar13 + 2] ^ 0x73;
        goto LAB_001f3c78;
      }
      break;
    case 0x76:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        uVar4 = *(ushort *)(zStem + uVar13) ^ 0x7669;
LAB_001f3afd:
        bVar15 = zStem[uVar13 + 2] ^ 0x65;
        goto LAB_001f3c78;
      }
      break;
    case 0x7a:
      if (3 < (int)uVar18) {
        uVar13 = (ulong)(uVar18 - 3);
        uVar4 = *(ushort *)(zStem + uVar13) ^ 0x7a69;
        goto LAB_001f3afd;
      }
    }
  }
  if (zStem[(long)(int)uVar10 + -1] == 'e') {
    uVar13 = (long)(int)uVar10 - 1;
    iVar5 = (int)uVar13;
    iVar6 = fts5Porter_MGt1(zStem,iVar5);
    if ((iVar6 != 0) ||
       ((iVar6 = fts5Porter_MEq1(zStem,iVar5), iVar6 != 0 &&
        (iVar6 = fts5Porter_Ostar(zStem,iVar5), iVar6 == 0)))) {
      uVar10 = uVar13 & 0xffffffff;
    }
  }
  if ((((1 < (int)uVar10) && (uVar18 = (int)uVar10 - 1, zStem[uVar18] == 'l')) &&
      (zStem[uVar10 - 2] == 'l')) && (iVar6 = fts5Porter_MGt1(zStem,uVar18), iVar6 != 0)) {
    uVar10 = (ulong)uVar18;
  }
  uVar16 = *pCtx;
  UNRECOVERED_JUMPTABLE = *(code **)((long)pCtx + 8);
  uVar13 = (ulong)(uint)tflags;
  uVar7 = (ulong)(uint)iStart;
LAB_001f3cef:
  iVar6 = (*UNRECOVERED_JUMPTABLE)(uVar16,uVar13,zStem,uVar10,uVar7,iEnd);
  return iVar6;
}

Assistant:

static int fts5PorterCb(
  void *pCtx,
  int tflags,
  const char *pToken,
  int nToken,
  int iStart,
  int iEnd
){
  PorterContext *p = (PorterContext*)pCtx;

  char *aBuf;
  int nBuf;

  if( nToken>FTS5_PORTER_MAX_TOKEN || nToken<3 ) goto pass_through;
  aBuf = p->aBuf;
  nBuf = nToken;
  memcpy(aBuf, pToken, nBuf);

  /* Step 1. */
  fts5PorterStep1A(aBuf, &nBuf);
  if( fts5PorterStep1B(aBuf, &nBuf) ){
    if( fts5PorterStep1B2(aBuf, &nBuf)==0 ){
      char c = aBuf[nBuf-1];
      if( fts5PorterIsVowel(c, 0)==0
       && c!='l' && c!='s' && c!='z' && c==aBuf[nBuf-2]
      ){
        nBuf--;
      }else if( fts5Porter_MEq1(aBuf, nBuf) && fts5Porter_Ostar(aBuf, nBuf) ){
        aBuf[nBuf++] = 'e';
      }
    }
  }

  /* Step 1C. */
  if( aBuf[nBuf-1]=='y' && fts5Porter_Vowel(aBuf, nBuf-1) ){
    aBuf[nBuf-1] = 'i';
  }

  /* Steps 2 through 4. */
  fts5PorterStep2(aBuf, &nBuf);
  fts5PorterStep3(aBuf, &nBuf);
  fts5PorterStep4(aBuf, &nBuf);

  /* Step 5a. */
  assert( nBuf>0 );
  if( aBuf[nBuf-1]=='e' ){
    if( fts5Porter_MGt1(aBuf, nBuf-1)
     || (fts5Porter_MEq1(aBuf, nBuf-1) && !fts5Porter_Ostar(aBuf, nBuf-1))
    ){
      nBuf--;
    }
  }

  /* Step 5b. */
  if( nBuf>1 && aBuf[nBuf-1]=='l'
   && aBuf[nBuf-2]=='l' && fts5Porter_MGt1(aBuf, nBuf-1)
  ){
    nBuf--;
  }

  return p->xToken(p->pCtx, tflags, aBuf, nBuf, iStart, iEnd);

 pass_through:
  return p->xToken(p->pCtx, tflags, pToken, nToken, iStart, iEnd);
}